

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void av1_set_target_rate(AV1_COMP *cpi,int width,int height)

{
  long in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int target_rate;
  RATE_CONTROL *rc;
  int *in_stack_00000098;
  AV1_COMP *in_stack_000000a0;
  
  if ((*(int *)(in_RDI + 0x423dc) == 0) || (*(int *)(in_RDI + 0x423dc) == 2)) {
    vbr_rate_correction(in_stack_000000a0,in_stack_00000098);
  }
  av1_rc_set_frame_target((AV1_COMP *)rc,target_rate,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

void av1_set_target_rate(AV1_COMP *cpi, int width, int height) {
  RATE_CONTROL *const rc = &cpi->rc;
  int target_rate = rc->base_frame_target;

  // Correction to rate target based on prior over or under shoot.
  if (cpi->oxcf.rc_cfg.mode == AOM_VBR || cpi->oxcf.rc_cfg.mode == AOM_CQ)
    vbr_rate_correction(cpi, &target_rate);
  av1_rc_set_frame_target(cpi, target_rate, width, height);
}